

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

SBuf * strfmt_putquotedlen(SBuf *sb,char *s,MSize len)

{
  char cVar1;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  
  pcVar3 = sb->w;
  if (*(int *)&sb->e == (int)pcVar3) {
    pcVar3 = lj_buf_more2(sb,1);
  }
  *pcVar3 = '\"';
  pbVar2 = (byte *)(pcVar3 + 1);
  sb->w = (char *)pbVar2;
  if (len != 0) {
    lVar8 = 0;
    do {
      bVar6 = s[lVar8];
      if ((*(int *)&sb->e - (int)pbVar2 & 0xfffffffcU) == 0) {
        pbVar2 = (byte *)lj_buf_more2(sb,4);
      }
      if (((bVar6 == 10) || (bVar6 == 0x5c)) || (bVar6 == 0x22)) {
        *pbVar2 = 0x5c;
        pbVar2 = pbVar2 + 1;
      }
      else if ((""[(ulong)bVar6 + 1] & 1) != 0) {
        *pbVar2 = 0x5c;
        bVar7 = 0x31;
        if ((bVar6 < 100) && (bVar7 = 0x30, (""[(ulong)(byte)s[lVar8 + 1] + 1] & 8) == 0)) {
          pbVar2 = pbVar2 + 1;
          pbVar5 = pbVar2;
          uVar4 = (uint)bVar6;
          if (9 < bVar6) goto LAB_0010f0d7;
        }
        else {
          pbVar5 = pbVar2 + 2;
          pbVar2[1] = bVar7;
          uVar4 = bVar6 - 100;
          if (bVar6 < 100) {
            uVar4 = (uint)bVar6;
          }
LAB_0010f0d7:
          cVar1 = (char)(uVar4 * 0xcd >> 0xb);
          bVar6 = cVar1 * -10 + (char)uVar4;
          *pbVar5 = cVar1 + 0x30;
          pbVar2 = pbVar5 + 1;
        }
        bVar6 = bVar6 + 0x30;
      }
      *pbVar2 = bVar6;
      pbVar2 = pbVar2 + 1;
      sb->w = (char *)pbVar2;
      lVar8 = lVar8 + 1;
    } while (len != (MSize)lVar8);
  }
  if (*(int *)&sb->e == (int)pbVar2) {
    pbVar2 = (byte *)lj_buf_more2(sb,1);
  }
  *pbVar2 = 0x22;
  sb->w = (char *)(pbVar2 + 1);
  return sb;
}

Assistant:

static SBuf *strfmt_putquotedlen(SBuf *sb, const char *s, MSize len)
{
  lj_buf_putb(sb, '"');
  while (len--) {
    uint32_t c = (uint32_t)(uint8_t)*s++;
    char *w = lj_buf_more(sb, 4);
    if (c == '"' || c == '\\' || c == '\n') {
      *w++ = '\\';
    } else if (lj_char_iscntrl(c)) {  /* This can only be 0-31 or 127. */
      uint32_t d;
      *w++ = '\\';
      if (c >= 100 || lj_char_isdigit((uint8_t)*s)) {
	*w++ = (char)('0'+(c >= 100)); if (c >= 100) c -= 100;
	goto tens;
      } else if (c >= 10) {
      tens:
	d = (c * 205) >> 11; c -= d * 10; *w++ = (char)('0'+d);
      }
      c += '0';
    }
    *w++ = (char)c;
    sb->w = w;
  }
  lj_buf_putb(sb, '"');
  return sb;
}